

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O3

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,JoinRef *ref)

{
  BindContext *pBVar1;
  JoinRefType JVar2;
  byte bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var5;
  LogicalType *pLVar6;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar7;
  pointer pbVar8;
  ClientContext *context;
  CorrelatedColumnInfo *pCVar9;
  pointer pCVar10;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var11;
  string *column_name_00;
  size_type sVar12;
  _Head_base<0UL,_duckdb::BoundJoinRef_*,_false> _Var13;
  TableRef *pTVar14;
  optional_ptr<duckdb::Binder,_true> oVar15;
  type pBVar16;
  undefined **ppuVar17;
  undefined **ppuVar18;
  undefined8 uVar19;
  char cVar20;
  bool bVar21;
  pointer pBVar22;
  pointer pBVar23;
  optional_ptr<duckdb::UsingColumnSet,_true> oVar24;
  iterator iVar25;
  reference pvVar26;
  UsingColumnSet *this_00;
  reference pvVar27;
  ComparisonExpression *this_01;
  type pUVar28;
  ConjunctionExpression *this_02;
  idx_t __val;
  undefined8 *puVar29;
  BinderException *pBVar30;
  long *plVar31;
  type pBVar32;
  CorrelatedColumnInfo *cor_col;
  pointer pCVar33;
  idx_t iVar34;
  long *plVar35;
  TableRef *in_RDX;
  const_iterator __begin1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  ExpressionType type;
  char cVar37;
  Binder *pBVar38;
  pointer pcVar39;
  BindContext *pBVar40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_name;
  pointer pbVar41;
  element_type *peVar42;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *col;
  optional_ptr<duckdb::LogicalType,_true> oVar43;
  size_type sVar44;
  CorrelatedColumnInfo *info;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding_ref;
  vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> left_using_bindings;
  vector<duckdb::BindingAlias,_true> left_bindings;
  vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> right_using_bindings;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> result;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> result_1;
  vector<duckdb::BindingAlias,_true> right_bindings;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  extra_conditions;
  _Head_base<0UL,_duckdb::BoundJoinRef_*,_false> local_470;
  TableRef *local_468;
  optional_ptr<duckdb::Binder,_true> local_460;
  type local_458;
  type local_450;
  _Head_base<0UL,_duckdb::UsingColumnSet_*,_false> local_448;
  Binder *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_418;
  _Head_base<0UL,_duckdb::UsingColumnSet_*,_false> local_400;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined **local_3b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined1 *local_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined1 *local_378;
  undefined1 *local_370;
  undefined1 local_368 [24];
  vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_> local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined1 local_2e8 [32];
  BindContext *local_2c8;
  string local_2c0;
  long *local_2a0;
  __node_base local_298;
  pointer local_290;
  undefined1 local_288 [8];
  pointer local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  undefined1 local_258 [16];
  _Alloc_hider local_248;
  undefined1 local_238 [16];
  undefined1 local_228 [32];
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> local_208;
  _Alloc_hider local_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [144];
  vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  local_160;
  undefined1 local_148 [56];
  BindContext local_110;
  
  local_470._M_head_impl = (BoundJoinRef *)operator_new(0x90);
  JVar2 = *(JoinRefType *)((long)&in_RDX[1].alias._M_string_length + 1);
  ((local_470._M_head_impl)->super_BoundTableRef).type = JOIN;
  ((local_470._M_head_impl)->super_BoundTableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false> =
       (_Head_base<0UL,_duckdb::SampleOptions_*,_false>)0x0;
  ((local_470._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef =
       (_func_int **)&PTR__BoundJoinRef_0244c250;
  ((local_470._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_470._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_470._M_head_impl)->condition).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  ((local_470._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_470._M_head_impl)->left).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false> =
       (_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)0x0;
  ((local_470._M_head_impl)->right).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false> =
       (_Head_base<0UL,_duckdb::BoundTableRef_*,_false>)0x0;
  ((local_470._M_head_impl)->right_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_470._M_head_impl)->right_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_470._M_head_impl)->left_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_470._M_head_impl)->left_binder).internal.
  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_470._M_head_impl)->type = INNER;
  (local_470._M_head_impl)->ref_type = JVar2;
  (local_470._M_head_impl)->lateral = false;
  ((local_470._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_470._M_head_impl)->mark_index = 0;
  ((local_470._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_470._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468 = in_RDX;
  local_460.ptr = (Binder *)ref;
  CreateBinder((Binder *)local_3b8,(ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
               (optional_ptr<duckdb::Binder,_true>)ref,REGULAR_BINDER);
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  ppuVar18 = local_3b8[1];
  ppuVar17 = local_3b8[0];
  local_3b8[0] = (undefined **)0x0;
  local_3b8[1] = (undefined **)0x0;
  p_Var4 = (pBVar22->left_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar22->left_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ppuVar17;
  (pBVar22->left_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar18;
  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[1] !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[1]);
  }
  CreateBinder((Binder *)local_3b8,(local_460.ptr)->context,local_460,REGULAR_BINDER);
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  ppuVar18 = local_3b8[1];
  ppuVar17 = local_3b8[0];
  local_3b8[0] = (undefined **)0x0;
  local_3b8[1] = (undefined **)0x0;
  p_Var4 = (pBVar22->right_binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pBVar22->right_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ppuVar17;
  (pBVar22->right_binder).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar18;
  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[1] !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8[1]);
  }
  local_208._M_head_impl = (BoundTableRef *)this;
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  local_450 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar22->left_binder);
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  local_458 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar22->right_binder);
  sVar12 = local_468[1].alias._M_string_length;
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  pTVar14 = local_468;
  pBVar22->type = (JoinType)sVar12;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             (local_468 + 1));
  pBVar16 = local_450;
  oVar15.ptr = local_460.ptr;
  local_450->unnamed_subquery_index = (local_460.ptr)->unnamed_subquery_index;
  Bind((Binder *)local_3b8,(TableRef *)local_450);
  (oVar15.ptr)->unnamed_subquery_index = pBVar16->unnamed_subquery_index;
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  ppuVar17 = local_3b8[0];
  local_3b8[0] = (undefined **)0x0;
  _Var5._M_head_impl =
       (pBVar22->left).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar22->left).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)ppuVar17;
  if ((_Var5._M_head_impl != (BoundTableRef *)0x0) &&
     ((**(code **)((long)(_Var5._M_head_impl)->_vptr_BoundTableRef + 8))(),
     local_3b8[0] != (undefined **)0x0)) {
    (**(code **)((long)*local_3b8[0] + 8))();
  }
  bVar21 = *(bool *)&pTVar14[1].column_name_alias.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  pBVar22->delim_flipped = bVar21;
  LateralBinder::LateralBinder((LateralBinder *)local_3b8,local_450,(local_460.ptr)->context);
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             &local_468[1].type);
  pBVar16 = local_458;
  oVar15.ptr = local_460.ptr;
  local_458->unnamed_subquery_index = (local_460.ptr)->unnamed_subquery_index;
  Bind((Binder *)&local_338,(TableRef *)local_458);
  (oVar15.ptr)->unnamed_subquery_index = pBVar16->unnamed_subquery_index;
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  uVar19 = local_338._M_allocated_capacity;
  local_338._M_allocated_capacity = 0;
  _Var5._M_head_impl =
       (pBVar22->right).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar22->right).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)uVar19;
  if ((_Var5._M_head_impl != (BoundTableRef *)0x0) &&
     ((**(code **)((long)(_Var5._M_head_impl)->_vptr_BoundTableRef + 8))(),
     (long *)local_338._M_allocated_capacity != (long *)0x0)) {
    (**(code **)(*(long *)local_338._M_allocated_capacity + 8))();
  }
  if ((element_type *)local_468[1].query_location.index !=
      local_468[1].external_dependency.internal.
      super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    if (*(char *)&local_468[1].column_name_alias.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\x01') {
      ExpressionBinder::ExpressionBinder
                ((ExpressionBinder *)&local_338,local_458,(local_460.ptr)->context,false);
      oVar43.ptr = (LogicalType *)local_468[1].query_location.index;
      pLVar6 = (LogicalType *)
               local_468[1].external_dependency.internal.
               super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (oVar43.ptr != pLVar6) {
        do {
          pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                                  *)&local_470);
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_288,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_338._M_allocated_capacity,oVar43,false);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar22->duplicate_eliminated_columns,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_288);
          if (local_288 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_288 + 8))();
          }
          oVar43.ptr = (LogicalType *)&(oVar43.ptr)->type_info_;
        } while (oVar43.ptr != pLVar6);
      }
    }
    else {
      ExpressionBinder::ExpressionBinder
                ((ExpressionBinder *)&local_338,local_450,(local_460.ptr)->context,false);
      oVar43.ptr = (LogicalType *)local_468[1].query_location.index;
      pLVar6 = (LogicalType *)
               local_468[1].external_dependency.internal.
               super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (oVar43.ptr != pLVar6) {
        do {
          pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                    ::operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                                  *)&local_470);
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_288,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_338._M_allocated_capacity,oVar43,false);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar22->duplicate_eliminated_columns,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_288);
          if (local_288 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_288 + 8))();
          }
          oVar43.ptr = (LogicalType *)&(oVar43.ptr)->type_info_;
        } while (oVar43.ptr != pLVar6);
      }
    }
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&local_338);
  }
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
  operator=(&(pBVar22->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ,&(local_458->correlated_columns).
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           );
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  for (pCVar33 = (pBVar22->correlated_columns).
                 super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                 .
                 super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pCVar33 !=
      (pBVar22->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish; pCVar33 = pCVar33 + 1) {
    if (pCVar33->depth == 1) {
      bVar21 = true;
      goto LAB_011de6aa;
    }
  }
  bVar21 = false;
LAB_011de6aa:
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  pBVar22->lateral = bVar21;
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  if ((pBVar22->lateral == true) && ((byte)((byte)local_468[1].alias._M_string_length | 2) != 3)) {
    pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
    local_338._M_allocated_capacity = (size_type)local_328;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,
               "The combining JOIN type must be INNER or LEFT for a LATERAL reference","");
    BinderException::BinderException(pBVar30,(string *)&local_338);
    __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_3b8[0] = &PTR__LateralBinder_0244cb40;
  ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
  ~vector((vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_> *)
          (local_368 + 0x18));
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_3b8);
  local_228._16_8_ = 0;
  local_228._0_8_ = (element_type *)0x0;
  local_228._8_8_ = (element_type *)0x0;
  local_418.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar37 = *(char *)((long)&local_468[1].alias._M_string_length + 1);
  if (cVar37 != '\0') {
    if (cVar37 == '\x01') {
      local_338._M_allocated_capacity = (size_type)&aStack_308;
      local_338._8_8_ = &DAT_00000001;
      local_328._0_8_ = (pointer)0x0;
      local_328._8_8_ = 0;
      local_318._0_4_ = 0x3f800000;
      local_318._8_8_ = 0;
      aStack_308._M_allocated_capacity = 0;
      this_03 = (local_450->bind_context).bindings_list.
                super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar7 = (local_450->bind_context).bindings_list.
               super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_03 != puVar7) {
        do {
          pBVar23 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                    operator->(this_03);
          pbVar8 = (pBVar23->names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar41 = (pBVar23->names).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar41 != pbVar8;
              pbVar41 = pbVar41 + 1) {
            local_3b8[0] = (undefined **)&local_338;
            ::std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_338,pbVar41,
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_3b8);
          }
          this_03 = this_03 + 1;
        } while (this_03 != puVar7);
        if ((pointer)local_328._0_8_ != (pointer)0x0) {
          pBVar1 = &local_458->bind_context;
          pcVar39 = (pointer)local_328._0_8_;
          do {
            column_name_00 = (string *)(pcVar39 + 8);
            oVar24 = BindContext::GetUsingBinding(pBVar1,column_name_00);
            BindingAlias::BindingAlias((BindingAlias *)local_3b8);
            if (oVar24.ptr == (UsingColumnSet *)0x0) {
              local_288 = (undefined1  [8])&local_278;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"right","");
              bVar21 = TryFindBinding(local_458,column_name_00,(string *)local_288,
                                      (BindingAlias *)local_3b8);
              if (local_288 != (undefined1  [8])&local_278) {
                operator_delete((void *)local_288);
              }
              if (bVar21) goto LAB_011de8b8;
            }
            else {
LAB_011de8b8:
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_418,column_name_00);
            }
            if (local_378 != local_368) {
              operator_delete(local_378);
            }
            if ((undefined8 *)CONCAT44(uStack_394,local_398) != &uStack_388) {
              operator_delete((undefined1 *)CONCAT44(uStack_394,local_398));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8[0] != &local_3a8) {
              operator_delete(local_3b8[0]);
            }
            pcVar39 = *(pointer *)pcVar39;
          } while (pcVar39 != (pointer)0x0);
        }
      }
      if (local_418.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_418.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_3b8[0] = (undefined **)&local_3a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3b8,"No columns found to join on in NATURAL JOIN.\n","");
        ::std::__cxx11::string::append
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8)->_M_local_buf);
        local_288 = (undefined1  [8])&local_278;
        local_280 = (pointer)0x0;
        local_278._M_local_buf[0] = '\0';
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        local_3f8._M_string_length = 0;
        local_3f8.field_2._M_local_buf[0] = '\0';
        pBVar38 = (Binder *)
                  (local_450->bind_context).bindings_list.
                  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_440 = (Binder *)
                    (local_450->bind_context).bindings_list.
                    super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar38 != local_440) {
          do {
            local_460.ptr = pBVar38;
            pBVar32 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                      operator*((unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>
                                 *)pBVar38);
            pbVar8 = (pBVar32->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar41 = (pBVar32->names).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar41 != pbVar8;
                pbVar41 = pbVar41 + 1) {
              if (local_280 != (pointer)0x0) {
                ::std::__cxx11::string::append(local_288);
              }
              Binding::GetAlias_abi_cxx11_((string *)(local_2e8 + 0x28),pBVar32);
              plVar31 = (long *)::std::__cxx11::string::append((char *)(local_2e8 + 0x28));
              plVar35 = plVar31 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar35) {
                local_3d8.field_2._M_allocated_capacity = *plVar35;
                local_3d8.field_2._8_8_ = plVar31[3];
                local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
              }
              else {
                local_3d8.field_2._M_allocated_capacity = *plVar35;
                local_3d8._M_dataplus._M_p = (pointer)*plVar31;
              }
              local_3d8._M_string_length = plVar31[1];
              *plVar31 = (long)plVar35;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              ::std::operator+(&local_438,&local_3d8,pbVar41);
              ::std::__cxx11::string::_M_append(local_288,(ulong)local_438._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                operator_delete(local_438._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p);
              }
            }
            pBVar38 = (Binder *)
                      &((local_460.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_
                       .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
          } while (pBVar38 != local_440);
        }
        pBVar38 = (Binder *)
                  (local_458->bind_context).bindings_list.
                  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_440 = (Binder *)
                    (local_458->bind_context).bindings_list.
                    super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar38 != local_440) {
          do {
            local_460.ptr = pBVar38;
            pBVar32 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                      operator*((unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>
                                 *)pBVar38);
            pbVar8 = (pBVar32->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar41 = (pBVar32->names).
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar41 != pbVar8;
                pbVar41 = pbVar41 + 1) {
              if (local_3f8._M_string_length != 0) {
                ::std::__cxx11::string::append((char *)&local_3f8);
              }
              Binding::GetAlias_abi_cxx11_((string *)(local_2e8 + 0x28),pBVar32);
              puVar29 = (undefined8 *)::std::__cxx11::string::append((char *)(local_2e8 + 0x28));
              plVar31 = puVar29 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar29 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar31) {
                local_3d8.field_2._M_allocated_capacity = *plVar31;
                local_3d8.field_2._8_8_ = puVar29[3];
                local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
              }
              else {
                local_3d8.field_2._M_allocated_capacity = *plVar31;
                local_3d8._M_dataplus._M_p = (pointer)*puVar29;
              }
              local_3d8._M_string_length = puVar29[1];
              *puVar29 = plVar31;
              puVar29[1] = 0;
              *(undefined1 *)(puVar29 + 2) = 0;
              ::std::operator+(&local_438,&local_3d8,pbVar41);
              ::std::__cxx11::string::_M_append
                        ((char *)&local_3f8,(ulong)local_438._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                operator_delete(local_438._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p);
              }
            }
            pBVar38 = (Binder *)
                      &((local_460.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_
                       .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
          } while (pBVar38 != local_440);
        }
        ::std::operator+(&local_438,"\n   Left candidates: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288);
        ::std::__cxx11::string::_M_append
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8)->_M_local_buf,(ulong)local_438._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        ::std::operator+(&local_438,"\n   Right candidates: ",&local_3f8);
        ::std::__cxx11::string::_M_append
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8)->_M_local_buf,(ulong)local_438._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
        BinderException::BinderException<>(pBVar30,local_468,(string *)local_3b8);
        __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_338);
      goto LAB_011de93d;
    }
    if (cVar37 != '\x04') goto LAB_011de93d;
  }
  if (local_468[1].alias.field_2._M_allocated_capacity !=
      *(size_type *)((long)&local_468[1].alias.field_2 + 8)) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_418,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_468[1].alias.field_2);
  }
LAB_011de93d:
  pbVar41 = local_418.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_338._M_allocated_capacity = 0;
  local_338._8_8_ = 0;
  local_328._0_8_ = (pointer)0x0;
  local_3b8[0] = (undefined **)&uStack_388;
  local_3b8[1] = (undefined **)&DAT_00000001;
  local_3a8._M_allocated_capacity = 0;
  local_3a8._8_8_ = 0;
  local_398 = 0x3f800000;
  local_390 = (undefined1 *)0x0;
  uStack_388 = 0;
  if (local_418.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_418.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar25 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_3b8,(key_type *)paVar36);
      if (iVar25.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_288 = (undefined1  [8])local_3b8;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_3b8,paVar36,local_288);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_338._M_local_buf,(value_type *)paVar36);
      }
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar36->_M_local_buf + 0x20);
    } while (paVar36 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pbVar41);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_3b8);
  local_3a8._M_allocated_capacity =
       (size_type)
       local_418.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3b8[1] = (undefined **)
                 local_418.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_3b8[0] = (undefined **)
                 local_418.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_418.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_328._0_8_;
  local_418.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_338._M_allocated_capacity;
  local_418.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_338._8_8_;
  local_338._M_allocated_capacity = 0;
  local_338._8_8_ = 0;
  local_328._0_8_ = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8)->_M_local_buf);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_338._M_local_buf);
  if (local_418.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_418.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_438._M_dataplus._M_p = (pointer)0x0;
    local_438._M_string_length = 0;
    sVar44 = 0;
    local_438.field_2._M_allocated_capacity = 0;
    local_3d8.field_2._M_allocated_capacity = 0;
    local_3d8._M_dataplus._M_p = (pointer)0x0;
    local_3d8._M_string_length = 0;
    pBVar1 = &local_450->bind_context;
    pBVar40 = &local_458->bind_context;
    do {
      pvVar26 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[](&local_418,sVar44);
      local_3b8[0] = (undefined **)BindContext::GetUsingBinding(pBVar1,pvVar26);
      local_338._M_allocated_capacity = (size_type)BindContext::GetUsingBinding(pBVar40,pvVar26);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8[0] ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        BindContext::GetMatchingBinding(pBVar1,pvVar26);
      }
      if ((UsingColumnSet *)local_338._M_allocated_capacity == (UsingColumnSet *)0x0) {
        BindContext::GetMatchingBinding(pBVar40,pvVar26);
      }
      if (local_438._M_string_length == local_438.field_2._M_allocated_capacity) {
        ::std::
        vector<duckdb::optional_ptr<duckdb::UsingColumnSet,true>,std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,true>>>
        ::_M_realloc_insert<duckdb::optional_ptr<duckdb::UsingColumnSet,true>const&>
                  ((vector<duckdb::optional_ptr<duckdb::UsingColumnSet,true>,std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,true>>>
                    *)&local_438,(iterator)local_438._M_string_length,
                   (optional_ptr<duckdb::UsingColumnSet,_true> *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_3b8)->_M_allocated_capacity);
      }
      else {
        *(UsingColumnSet **)local_438._M_string_length = (UsingColumnSet *)local_3b8[0];
        local_438._M_string_length = local_438._M_string_length + 8;
      }
      if (local_3d8._M_string_length == local_3d8.field_2._M_allocated_capacity) {
        ::std::
        vector<duckdb::optional_ptr<duckdb::UsingColumnSet,true>,std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,true>>>
        ::_M_realloc_insert<duckdb::optional_ptr<duckdb::UsingColumnSet,true>const&>
                  ((vector<duckdb::optional_ptr<duckdb::UsingColumnSet,true>,std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,true>>>
                    *)&local_3d8,(iterator)local_3d8._M_string_length,
                   (optional_ptr<duckdb::UsingColumnSet,_true> *)&local_338._M_allocated_capacity);
      }
      else {
        *(UsingColumnSet **)local_3d8._M_string_length =
             (UsingColumnSet *)local_338._M_allocated_capacity;
        local_3d8._M_string_length = local_3d8._M_string_length + 8;
      }
      sVar44 = sVar44 + 1;
    } while (sVar44 < (ulong)((long)local_418.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_418.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
    if (local_418.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_418.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_2c8 = &(local_460.ptr)->bind_context;
      local_1f8 = (undefined1  [8])&local_450->bind_context;
      local_200._M_p = (pointer)&local_458->bind_context;
      sVar44 = 0;
      do {
        pvVar26 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[](&local_418,sVar44);
        BindingAlias::BindingAlias((BindingAlias *)&local_338);
        BindingAlias::BindingAlias((BindingAlias *)local_288);
        this_00 = (UsingColumnSet *)operator_new(0x78);
        (this_00->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this_00->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_00->primary_binding).alias.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(this_00->primary_binding).alias.field_2 + 8) = 0;
        (this_00->primary_binding).alias._M_dataplus._M_p = (pointer)0x0;
        (this_00->primary_binding).alias._M_string_length = 0;
        (this_00->primary_binding).schema.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(this_00->primary_binding).schema.field_2 + 8) = 0;
        (this_00->primary_binding).schema._M_dataplus._M_p = (pointer)0x0;
        (this_00->primary_binding).schema._M_string_length = 0;
        (this_00->primary_binding).catalog.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(this_00->primary_binding).catalog.field_2 + 8) = 0;
        (this_00->primary_binding).catalog._M_dataplus._M_p = (pointer)0x0;
        (this_00->primary_binding).catalog._M_string_length = 0;
        (this_00->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        BindingAlias::BindingAlias((BindingAlias *)this_00);
        (this_00->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this_00->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_00->bindings).
        super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
        super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_448._M_head_impl = this_00;
        pvVar27 = vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true>::operator[]
                            ((vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> *)
                             &local_438,sVar44);
        local_440 = (Binder *)
                    vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true>::operator[]
                              ((vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> *)
                               &local_3d8,sVar44);
        oVar24.ptr = pvVar27->ptr;
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        pBVar38 = (Binder *)0x1e148e7;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"left","");
        RetrieveUsingBinding((BindingAlias *)local_3b8,pBVar38,local_450,oVar24,pvVar26,&local_3f8);
        ::std::__cxx11::string::operator=
                  ((string *)local_338._M_local_buf,
                   (string *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8)->_M_local_buf);
        ::std::__cxx11::string::operator=((string *)(local_328 + 0x10),(string *)&local_398);
        ::std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,(string *)&local_378);
        if (local_378 != local_368) {
          operator_delete(local_378);
        }
        if ((undefined8 *)CONCAT44(uStack_394,local_398) != &uStack_388) {
          operator_delete((undefined1 *)CONCAT44(uStack_394,local_398));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8[0] != &local_3a8) {
          operator_delete(local_3b8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        oVar24.ptr = *(UsingColumnSet **)&local_440->super_enable_shared_from_this<duckdb::Binder>;
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        pBVar38 = (Binder *)0x1e149e4;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"right","");
        RetrieveUsingBinding((BindingAlias *)local_3b8,pBVar38,local_458,oVar24,pvVar26,&local_3f8);
        ::std::__cxx11::string::operator=
                  ((string *)local_288,
                   (string *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8)->_M_local_buf);
        ::std::__cxx11::string::operator=((string *)&local_268,(string *)&local_398);
        ::std::__cxx11::string::operator=((string *)&local_248,(string *)&local_378);
        if (local_378 != local_368) {
          operator_delete(local_378);
        }
        if ((undefined8 *)CONCAT44(uStack_394,local_398) != &uStack_388) {
          operator_delete((undefined1 *)CONCAT44(uStack_394,local_398));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8[0] != &local_3a8) {
          operator_delete(local_3b8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        pBVar16 = local_450;
        type = COMPARE_BOUNDARY_START;
        if (*(char *)((long)&local_468[1].alias._M_string_length + 1) == '\x04') {
          type = (sVar44 ==
                 ((long)local_418.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_418.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) * '\x05' +
                 COMPARE_BOUNDARY_START;
        }
        context = (local_460.ptr)->context;
        ExpressionBinder::ExpressionBinder((ExpressionBinder *)local_3b8,local_450,context,false);
        BindColumn((duckdb *)&local_2a0,pBVar16,context,(BindingAlias *)&local_338,pvVar26);
        BindColumn((duckdb *)&local_290,local_458,context,(BindingAlias *)local_288,pvVar26);
        this_01 = (ComparisonExpression *)operator_new(0x48);
        local_3f8._M_dataplus._M_p = (pointer)local_2a0;
        local_2a0 = (long *)0x0;
        local_2c0._M_dataplus._M_p = (pointer)local_290;
        ComparisonExpression::ComparisonExpression
                  (this_01,type,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_3f8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)(local_2e8 + 0x28));
        if ((pointer)local_2c0._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)local_2c0._M_dataplus._M_p + 8))();
        }
        local_2c0._M_dataplus._M_p = (pointer)0x0;
        if ((long *)local_3f8._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_3f8._M_dataplus._M_p + 8))();
        }
        local_298._M_nxt = (_Hash_node_base *)this_01;
        ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_3b8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_228,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_298);
        if ((ComparisonExpression *)local_298._M_nxt != (ComparisonExpression *)0x0) {
          (*(((ParsedExpression *)&(local_298._M_nxt)->_M_nxt)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_448);
        AddUsingBindings(pUVar28,pvVar27->ptr,(BindingAlias *)&local_338);
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_448);
        AddUsingBindings(pUVar28,*(UsingColumnSet **)
                                  &local_440->super_enable_shared_from_this<duckdb::Binder>,
                         (BindingAlias *)local_288);
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_448);
        bVar3 = (byte)local_468[1].alias._M_string_length;
        if ((bVar3 < 0xb) &&
           (((0x6aU >> (bVar3 & 0x1f) & 1) != 0 || ((0x604U >> (bVar3 & 0x1f) & 1) != 0)))) {
          ::std::__cxx11::string::_M_assign((string *)pUVar28);
          ::std::__cxx11::string::_M_assign((string *)&(pUVar28->primary_binding).schema);
          ::std::__cxx11::string::_M_assign((string *)&(pUVar28->primary_binding).alias);
        }
        oVar24.ptr = pvVar27->ptr;
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_448);
        BindContext::TransferUsingBinding(local_2c8,(BindContext *)local_1f8,oVar24,pUVar28,pvVar26)
        ;
        oVar24.ptr = *(UsingColumnSet **)&local_440->super_enable_shared_from_this<duckdb::Binder>;
        pUVar28 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                  ::operator*((unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                               *)&local_448);
        BindContext::TransferUsingBinding
                  (local_2c8,(BindContext *)local_200._M_p,oVar24,pUVar28,pvVar26);
        local_400._M_head_impl = local_448._M_head_impl;
        local_448._M_head_impl = (UsingColumnSet *)0x0;
        AddUsingBindingSet(local_460.ptr,
                           (unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                            *)&local_400);
        if (local_400._M_head_impl != (UsingColumnSet *)0x0) {
          ::std::default_delete<duckdb::UsingColumnSet>::operator()
                    ((default_delete<duckdb::UsingColumnSet> *)&local_400,local_400._M_head_impl);
        }
        local_400._M_head_impl = (UsingColumnSet *)0x0;
        if (local_448._M_head_impl != (UsingColumnSet *)0x0) {
          ::std::default_delete<duckdb::UsingColumnSet>::operator()
                    ((default_delete<duckdb::UsingColumnSet> *)&local_448,local_448._M_head_impl);
        }
        if ((ClientContext *)local_248._M_p != (ClientContext *)local_238) {
          operator_delete(local_248._M_p);
        }
        if ((DummyBinding *)local_268._M_p != (DummyBinding *)local_258) {
          operator_delete(local_268._M_p);
        }
        if (local_288 != (undefined1  [8])&local_278) {
          operator_delete((void *)local_288);
        }
        if ((undefined1 *)local_2f8._M_allocated_capacity != local_2e8) {
          operator_delete((void *)local_2f8._M_allocated_capacity);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_318._4_4_,local_318._0_4_) != &aStack_308) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_318._4_4_,local_318._0_4_));
        }
        if ((UsingColumnSet *)local_338._M_allocated_capacity != (UsingColumnSet *)local_328) {
          operator_delete((void *)local_338._M_allocated_capacity);
        }
        sVar44 = sVar44 + 1;
      } while (sVar44 < (ulong)((long)local_418.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_418.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    if (local_438._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_438._M_dataplus._M_p);
    }
  }
  pBVar1 = &local_458->bind_context;
  BindContext::GetBindingAliases((vector<duckdb::BindingAlias,_true> *)local_288,pBVar1);
  pBVar16 = local_450;
  pBVar40 = &local_450->bind_context;
  local_2c8 = pBVar1;
  BindContext::GetBindingAliases((vector<duckdb::BindingAlias,_true> *)&local_3f8,pBVar40);
  pBVar1 = &(local_460.ptr)->bind_context;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&local_110,pBVar40,pBVar40);
  local_110.binder = (pBVar16->bind_context).binder;
  local_110.bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pBVar16->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_110.bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pBVar16->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_110.bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pBVar16->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar16->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)((long)&local_110 + 0x58),&(pBVar16->bind_context).using_columns);
  local_110.using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_110.using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_110.using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)((long)&local_110 + 0xa8),&(pBVar16->bind_context).cte_bindings);
  local_440 = (Binder *)pBVar1;
  BindContext::AddContext(pBVar1,&local_110);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&local_110 + 0xa8));
  ::std::
  vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             *)((long)&local_110 + 0x90));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&local_110 + 0x58));
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             *)((long)&local_110 + 0x40));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_110);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_1f0,local_2c8);
  pBVar16 = local_458;
  local_1f0._56_8_ = (local_458->bind_context).binder;
  local_1f0._64_8_ =
       (local_458->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1f0._72_8_ =
       (local_458->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1f0._80_8_ =
       (local_458->bind_context).bindings_list.
       super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_458->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_458->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_458->bind_context).bindings_list.
  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_1f0 + 0x58),&(local_458->bind_context).using_columns);
  local_160.
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_160.
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_160.
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pBVar16->bind_context).using_column_sets.
       super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar16->bind_context).using_column_sets.
  super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_148,&(pBVar16->bind_context).cte_bindings);
  BindContext::AddContext((BindContext *)local_440,(BindContext *)local_1f0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_148);
  ::std::
  vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
  ::~vector(&local_160);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1f0 + 0x58));
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             *)(local_1f0 + 0x40));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1f0);
  pCVar9 = (local_450->correlated_columns).
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (info = (local_450->correlated_columns).
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              .
              super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              ._M_impl.super__Vector_impl_data._M_start; info != pCVar9; info = info + 1) {
    if (info->depth != 0) {
      AddCorrelatedColumn(local_460.ptr,info);
    }
  }
  pCVar33 = (local_458->correlated_columns).
            super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            .
            super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar10 = (local_458->correlated_columns).
            super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            .
            super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar33 != pCVar10) {
    do {
      local_3b8[0] = (undefined **)(pCVar33->binding).table_index;
      local_3b8[1] = (undefined **)(pCVar33->binding).column_index;
      LogicalType::LogicalType((LogicalType *)&local_3a8,&pCVar33->type);
      pcVar39 = (pCVar33->name)._M_dataplus._M_p;
      local_390 = local_380;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390,pcVar39,pcVar39 + (pCVar33->name)._M_string_length);
      local_370 = (undefined1 *)pCVar33->depth;
      if (&DAT_00000001 < local_370) {
        local_370 = (undefined1 *)((long)local_370 + 0xffffffffffffffff);
        AddCorrelatedColumn(local_460.ptr,(CorrelatedColumnInfo *)local_3b8);
      }
      if (local_390 != local_380) {
        operator_delete(local_390);
      }
      LogicalType::~LogicalType((LogicalType *)&local_3a8);
      pCVar33 = pCVar33 + 1;
    } while (pCVar33 != pCVar10);
  }
  uVar19 = local_228._8_8_;
  if (local_228._0_8_ != local_228._8_8_) {
    peVar42 = (element_type *)local_228._0_8_;
    do {
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468[1].alias._M_dataplus._M_p;
      if (paVar36 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar39 = (((string *)&peVar42->super_enable_shared_from_this<duckdb::DatabaseInstance>)->
                  _M_dataplus)._M_p;
        (((string *)&peVar42->super_enable_shared_from_this<duckdb::DatabaseInstance>)->_M_dataplus)
        ._M_p = (pointer)0x0;
        plVar31 = (long *)local_468[1].alias._M_dataplus._M_p;
        local_468[1].alias._M_dataplus._M_p = pcVar39;
      }
      else {
        this_02 = (ConjunctionExpression *)operator_new(0x50);
        local_468[1].alias._M_dataplus._M_p = (pointer)0x0;
        local_338._M_allocated_capacity =
             (size_type)
             (((string *)&peVar42->super_enable_shared_from_this<duckdb::DatabaseInstance>)->
             _M_dataplus)._M_p;
        (((string *)&peVar42->super_enable_shared_from_this<duckdb::DatabaseInstance>)->_M_dataplus)
        ._M_p = (pointer)0x0;
        local_3b8[0] = (undefined **)paVar36;
        ConjunctionExpression::ConjunctionExpression
                  (this_02,CONJUNCTION_AND,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8)->_M_allocated_capacity,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_338._M_allocated_capacity);
        if ((long *)local_338._M_allocated_capacity != (long *)0x0) {
          (**(code **)(*(long *)local_338._M_allocated_capacity + 8))();
        }
        local_338._M_allocated_capacity = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8[0] !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)((long)*local_3b8[0] + 8))();
        }
        plVar31 = (long *)local_468[1].alias._M_dataplus._M_p;
        local_468[1].alias._M_dataplus._M_p = (pointer)this_02;
      }
      if (plVar31 != (long *)0x0) {
        (**(code **)(*plVar31 + 8))();
      }
      peVar42 = (element_type *)
                &((string *)&peVar42->super_enable_shared_from_this<duckdb::DatabaseInstance>)->
                 _M_string_length;
    } while (peVar42 != (element_type *)uVar19);
  }
  _Var5._M_head_impl = local_208._M_head_impl;
  pBVar38 = local_440;
  if (local_468[1].alias._M_dataplus._M_p != (pointer)0x0) {
    WhereBinder::WhereBinder
              ((WhereBinder *)local_3b8,local_460.ptr,(local_460.ptr)->context,
               (optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0);
    ExpressionBinder::Bind
              ((ExpressionBinder *)&local_338,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8)->_M_allocated_capacity,
               (optional_ptr<duckdb::LogicalType,_true>)&local_468[1].alias,false);
    pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_470);
    uVar19 = local_338._M_allocated_capacity;
    local_338._M_allocated_capacity = 0;
    _Var11._M_head_impl =
         (pBVar22->condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar22->condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar19;
    if ((_Var11._M_head_impl != (Expression *)0x0) &&
       ((**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))(),
       (UsingColumnSet *)local_338._M_allocated_capacity != (UsingColumnSet *)0x0)) {
      (**(code **)(*(long *)local_338._M_allocated_capacity + 8))();
    }
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_3b8);
  }
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  if (((pBVar22->type == SEMI) ||
      (pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                 operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                             *)&local_470), pBVar22->type == ANTI)) ||
     (pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                            *)&local_470), pBVar22->type == MARK)) {
    BindContext::RemoveContext
              ((BindContext *)pBVar38,(vector<duckdb::BindingAlias,_true> *)local_288);
    pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_470);
    if (pBVar22->type == MARK) {
      __val = GenerateTableIndex(local_460.ptr);
      cVar37 = '\x01';
      if (9 < __val) {
        iVar34 = __val;
        cVar20 = '\x04';
        do {
          cVar37 = cVar20;
          if (iVar34 < 100) {
            cVar37 = cVar37 + -2;
            goto LAB_011df746;
          }
          if (iVar34 < 1000) {
            cVar37 = cVar37 + -1;
            goto LAB_011df746;
          }
          if (iVar34 < 10000) goto LAB_011df746;
          bVar21 = 99999 < iVar34;
          iVar34 = iVar34 / 10000;
          cVar20 = cVar37 + '\x04';
        } while (bVar21);
        cVar37 = cVar37 + '\x01';
      }
LAB_011df746:
      local_338._M_allocated_capacity = (size_type)(UsingColumnSet *)local_328;
      ::std::__cxx11::string::_M_construct((ulong)&local_338,cVar37);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_338._M_allocated_capacity,local_338._8_4_,__val);
      puVar29 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x1de6766);
      paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar29 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar29 == paVar36) {
        local_3a8._M_allocated_capacity = paVar36->_M_allocated_capacity;
        local_3a8._8_8_ = puVar29[3];
        local_3b8[0] = (undefined **)&local_3a8;
      }
      else {
        local_3a8._M_allocated_capacity = paVar36->_M_allocated_capacity;
        local_3b8[0] = (undefined **)*puVar29;
      }
      local_3b8[1] = (undefined **)puVar29[1];
      *puVar29 = paVar36;
      puVar29[1] = 0;
      *(undefined1 *)(puVar29 + 2) = 0;
      if ((UsingColumnSet *)local_338._M_allocated_capacity != (UsingColumnSet *)local_328) {
        operator_delete((void *)local_338._M_allocated_capacity);
      }
      local_338._M_allocated_capacity = (size_type)(UsingColumnSet *)local_328;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"__mark_index_column","");
      __l._M_len = 1;
      __l._M_array = (iterator)&local_338;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_438,__l,(allocator_type *)&local_2a0);
      LogicalType::LogicalType((LogicalType *)(local_2e8 + 0x28),BOOLEAN);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)(local_2e8 + 0x28);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3d8,
                 __l_00,(allocator_type *)&local_290);
      BindContext::AddGenericBinding
                ((BindContext *)pBVar38,__val,(string *)local_3b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_438,(vector<duckdb::LogicalType,_true> *)&local_3d8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3d8);
      LogicalType::~LogicalType((LogicalType *)(local_2e8 + 0x28));
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_438);
      if ((UsingColumnSet *)local_338._M_allocated_capacity != (UsingColumnSet *)local_328) {
        operator_delete((void *)local_338._M_allocated_capacity);
      }
      pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                            *)&local_470);
      pBVar22->mark_index = __val;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8[0] != &local_3a8) {
        operator_delete(local_3b8[0]);
      }
    }
  }
  pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_470);
  if ((pBVar22->type == RIGHT_SEMI) ||
     (pBVar22 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                            *)&local_470), pBVar22->type == RIGHT_ANTI)) {
    BindContext::RemoveContext
              ((BindContext *)pBVar38,(vector<duckdb::BindingAlias,_true> *)&local_3f8);
  }
  _Var13._M_head_impl = local_470._M_head_impl;
  local_470._M_head_impl = (BoundJoinRef *)0x0;
  (_Var5._M_head_impl)->_vptr_BoundTableRef = (_func_int **)_Var13._M_head_impl;
  ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::~vector
            ((vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *)&local_3f8);
  ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::~vector
            ((vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *)local_288);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_418);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)local_228);
  if (local_470._M_head_impl != (BoundJoinRef *)0x0) {
    (*((local_470._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef[1])();
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (__uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         _Var5._M_head_impl;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(JoinRef &ref) {
	auto result = make_uniq<BoundJoinRef>(ref.ref_type);
	result->left_binder = Binder::CreateBinder(context, this);
	result->right_binder = Binder::CreateBinder(context, this);
	auto &left_binder = *result->left_binder;
	auto &right_binder = *result->right_binder;

	result->type = ref.type;
	result->left = left_binder.BindJoin(*this, *ref.left);
	result->delim_flipped = ref.delim_flipped;

	{
		LateralBinder binder(left_binder, context);
		result->right = right_binder.BindJoin(*this, *ref.right);
		if (!ref.duplicate_eliminated_columns.empty()) {
			if (ref.delim_flipped) {
				// We gotta use the expression binder of the right side
				ExpressionBinder expr_binder(right_binder, context);
				for (auto &col : ref.duplicate_eliminated_columns) {
					result->duplicate_eliminated_columns.emplace_back(expr_binder.Bind(col));
				}
			} else {
				// We use the left side
				ExpressionBinder expr_binder(left_binder, context);
				for (auto &col : ref.duplicate_eliminated_columns) {
					result->duplicate_eliminated_columns.emplace_back(expr_binder.Bind(col));
				}
			}
		}
		bool is_lateral = false;
		// Store the correlated columns in the right binder in bound ref for planning of LATERALs
		// Ignore the correlated columns in the left binder, flattening handles those correlations
		result->correlated_columns = right_binder.correlated_columns;
		// Find correlations for the current join
		for (auto &cor_col : result->correlated_columns) {
			if (cor_col.depth == 1) {
				// Depth 1 indicates columns binding from the left indicating a lateral join
				is_lateral = true;
				break;
			}
		}
		result->lateral = is_lateral;
		if (result->lateral) {
			// lateral join: can only be an INNER or LEFT join
			if (ref.type != JoinType::INNER && ref.type != JoinType::LEFT) {
				throw BinderException("The combining JOIN type must be INNER or LEFT for a LATERAL reference");
			}
		}
	}

	vector<unique_ptr<ParsedExpression>> extra_conditions;
	vector<string> extra_using_columns;
	switch (ref.ref_type) {
	case JoinRefType::NATURAL: {
		// natural join, figure out which column names are present in both sides of the join
		// first bind the left hand side and get a list of all the tables and column names
		case_insensitive_set_t lhs_columns;
		auto &lhs_binding_list = left_binder.bind_context.GetBindingsList();
		for (auto &binding : lhs_binding_list) {
			for (auto &column_name : binding->names) {
				lhs_columns.insert(column_name);
			}
		}
		// now bind the rhs
		for (auto &column_name : lhs_columns) {
			auto right_using_binding = right_binder.bind_context.GetUsingBinding(column_name);

			BindingAlias right_binding;
			// loop over the set of lhs columns, and figure out if there is a table in the rhs with the same name
			if (!right_using_binding) {
				if (!right_binder.TryFindBinding(column_name, "right", right_binding)) {
					// no match found for this column on the rhs: skip
					continue;
				}
			}
			extra_using_columns.push_back(column_name);
		}
		if (extra_using_columns.empty()) {
			// no matching bindings found in natural join: throw an exception
			string error_msg = "No columns found to join on in NATURAL JOIN.\n";
			error_msg += "Use CROSS JOIN if you intended for this to be a cross-product.";
			// gather all left/right candidates
			string left_candidates, right_candidates;
			auto &rhs_binding_list = right_binder.bind_context.GetBindingsList();
			for (auto &binding_ref : lhs_binding_list) {
				auto &binding = *binding_ref;
				for (auto &column_name : binding.names) {
					if (!left_candidates.empty()) {
						left_candidates += ", ";
					}
					left_candidates += binding.GetAlias() + "." + column_name;
				}
			}
			for (auto &binding_ref : rhs_binding_list) {
				auto &binding = *binding_ref;
				for (auto &column_name : binding.names) {
					if (!right_candidates.empty()) {
						right_candidates += ", ";
					}
					right_candidates += binding.GetAlias() + "." + column_name;
				}
			}
			error_msg += "\n   Left candidates: " + left_candidates;
			error_msg += "\n   Right candidates: " + right_candidates;
			throw BinderException(ref, error_msg);
		}
		break;
	}
	case JoinRefType::REGULAR:
	case JoinRefType::ASOF:
		if (!ref.using_columns.empty()) {
			// USING columns
			D_ASSERT(!result->condition);
			extra_using_columns = ref.using_columns;
		}
		break;

	case JoinRefType::CROSS:
	case JoinRefType::POSITIONAL:
	case JoinRefType::DEPENDENT:
		break;
	}
	extra_using_columns = RemoveDuplicateUsingColumns(extra_using_columns);

	if (!extra_using_columns.empty()) {
		vector<optional_ptr<UsingColumnSet>> left_using_bindings;
		vector<optional_ptr<UsingColumnSet>> right_using_bindings;
		for (idx_t i = 0; i < extra_using_columns.size(); i++) {
			auto &using_column = extra_using_columns[i];
			// we check if there is ALREADY a using column of the same name in the left and right set
			// this can happen if we chain USING clauses
			// e.g. x JOIN y USING (c) JOIN z USING (c)
			auto left_using_binding = left_binder.bind_context.GetUsingBinding(using_column);
			auto right_using_binding = right_binder.bind_context.GetUsingBinding(using_column);
			if (!left_using_binding) {
				left_binder.bind_context.GetMatchingBinding(using_column);
			}
			if (!right_using_binding) {
				right_binder.bind_context.GetMatchingBinding(using_column);
			}
			left_using_bindings.push_back(left_using_binding);
			right_using_bindings.push_back(right_using_binding);
		}

		for (idx_t i = 0; i < extra_using_columns.size(); i++) {
			auto &using_column = extra_using_columns[i];
			BindingAlias left_binding;
			BindingAlias right_binding;

			auto set = make_uniq<UsingColumnSet>();
			auto &left_using_binding = left_using_bindings[i];
			auto &right_using_binding = right_using_bindings[i];
			left_binding = RetrieveUsingBinding(left_binder, left_using_binding, using_column, "left");
			right_binding = RetrieveUsingBinding(right_binder, right_using_binding, using_column, "right");

			// Last column of ASOF JOIN ... USING is >=
			const auto type = (ref.ref_type == JoinRefType::ASOF && i == extra_using_columns.size() - 1)
			                      ? ExpressionType::COMPARE_GREATERTHANOREQUALTO
			                      : ExpressionType::COMPARE_EQUAL;

			extra_conditions.push_back(
			    AddCondition(context, left_binder, right_binder, left_binding, right_binding, using_column, type));

			AddUsingBindings(*set, left_using_binding, left_binding);
			AddUsingBindings(*set, right_using_binding, right_binding);
			SetPrimaryBinding(*set, ref.type, left_binding, right_binding);
			bind_context.TransferUsingBinding(left_binder.bind_context, left_using_binding, *set, using_column);
			bind_context.TransferUsingBinding(right_binder.bind_context, right_using_binding, *set, using_column);
			AddUsingBindingSet(std::move(set));
		}
	}

	auto right_bindings = right_binder.bind_context.GetBindingAliases();
	auto left_bindings = left_binder.bind_context.GetBindingAliases();

	bind_context.AddContext(std::move(left_binder.bind_context));
	bind_context.AddContext(std::move(right_binder.bind_context));

	// Update the correlated columns for the parent binder
	// For the left binder, depth >= 1 indicates correlations from the parent binder
	for (const auto &col : left_binder.correlated_columns) {
		if (col.depth >= 1) {
			AddCorrelatedColumn(col);
		}
	}
	// For the right binder, depth > 1 indicates correlations from the parent binder
	// (depth = 1 indicates correlations from the left side of the join)
	for (auto col : right_binder.correlated_columns) {
		if (col.depth > 1) {
			// Decrement the depth to account for the effect of the lateral binder
			col.depth--;
			AddCorrelatedColumn(col);
		}
	}

	for (auto &condition : extra_conditions) {
		if (ref.condition) {
			ref.condition = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(ref.condition),
			                                                 std::move(condition));
		} else {
			ref.condition = std::move(condition);
		}
	}
	if (ref.condition) {
		WhereBinder binder(*this, context);
		result->condition = binder.Bind(ref.condition);
	}

	if (result->type == JoinType::SEMI || result->type == JoinType::ANTI || result->type == JoinType::MARK) {
		bind_context.RemoveContext(right_bindings);
		if (result->type == JoinType::MARK) {
			auto mark_join_idx = GenerateTableIndex();
			string mark_join_alias = "__internal_mark_join_ref" + to_string(mark_join_idx);
			bind_context.AddGenericBinding(mark_join_idx, mark_join_alias, {"__mark_index_column"},
			                               {LogicalType::BOOLEAN});
			result->mark_index = mark_join_idx;
		}
	}
	if (result->type == JoinType::RIGHT_SEMI || result->type == JoinType::RIGHT_ANTI) {
		bind_context.RemoveContext(left_bindings);
	}

	return std::move(result);
}